

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O3

SFPreset * __thiscall sf2cute::SFPreset::operator=(SFPreset *this,SFPreset *origin)

{
  SFPresetZone *pSVar1;
  pointer puVar2;
  SFPreset *pSVar3;
  SFPreset *pSVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  SFPresetZone *pSVar7;
  pointer *__ptr_1;
  pointer *__ptr;
  pointer puVar8;
  pointer puVar9;
  _Head_base<0UL,_sf2cute::SFPresetZone_*,_false> local_48;
  SFPreset *local_40;
  SFPreset *local_38;
  
  pSVar1 = (this->global_zone_)._M_t.
           super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
           ._M_t.
           super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
           .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
  (this->global_zone_)._M_t.
  super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>._M_t.
  super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
  super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl = (SFPresetZone *)0x0;
  if (pSVar1 != (SFPresetZone *)0x0) {
    (**(code **)((long)(pSVar1->super_SFZone)._vptr_SFZone + 8))();
  }
  pSVar1 = (origin->global_zone_)._M_t.
           super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
           ._M_t.
           super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
           .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
  if (pSVar1 != (SFPresetZone *)0x0) {
    pSVar7 = (SFPresetZone *)operator_new(0x50);
    SFPresetZone::SFPresetZone(pSVar7,pSVar1);
    pSVar1 = (this->global_zone_)._M_t.
             super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
             ._M_t.
             super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
             .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
    (this->global_zone_)._M_t.
    super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
    super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl = pSVar7;
    if (pSVar1 != (SFPresetZone *)0x0) {
      (**(code **)((long)(pSVar1->super_SFZone)._vptr_SFZone + 8))();
    }
  }
  puVar9 = (this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar8 = puVar9;
  local_40 = this;
  local_38 = origin;
  if (puVar2 != puVar9) {
    do {
      pSVar1 = (puVar8->_M_t).
               super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
               ._M_t.
               super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
               .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
      if (pSVar1 != (SFPresetZone *)0x0) {
        (**(code **)((long)(pSVar1->super_SFZone)._vptr_SFZone + 8))();
      }
      (puVar8->_M_t).
      super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>._M_t
      .super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
      super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl = (SFPresetZone *)0x0;
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar2);
    (local_40->zones_).
    super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar9;
  }
  pSVar3 = local_38;
  std::
  vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ::reserve(&this->zones_,
            (long)(local_38->zones_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_38->zones_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar2 = (pSVar3->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar9 = (pSVar3->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = local_40;
  pSVar4 = local_38;
  for (; local_40 = pSVar3, local_38 = pSVar4, puVar9 != puVar2; puVar9 = puVar9 + 1) {
    pSVar1 = (puVar9->_M_t).
             super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
             ._M_t.
             super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
             .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
    pSVar7 = (SFPresetZone *)operator_new(0x50);
    SFPresetZone::SFPresetZone(pSVar7,pSVar1);
    local_48._M_head_impl = pSVar7;
    std::
    vector<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>,std::allocator<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>>
    ::
    emplace_back<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>
              ((vector<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>,std::allocator<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>>
                *)&this->zones_,
               (unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
               &local_48);
    if (local_48._M_head_impl != (SFPresetZone *)0x0) {
      (*((local_48._M_head_impl)->super_SFZone)._vptr_SFZone[1])();
    }
    pSVar3 = local_40;
    pSVar4 = local_38;
  }
  std::__cxx11::string::_M_assign((string *)pSVar3);
  uVar5 = pSVar4->bank_;
  pSVar3->preset_number_ = pSVar4->preset_number_;
  pSVar3->bank_ = uVar5;
  uVar6 = pSVar4->genre_;
  pSVar3->library_ = pSVar4->library_;
  pSVar3->genre_ = uVar6;
  pSVar3->morphology_ = pSVar4->morphology_;
  pSVar3->parent_file_ = (SoundFont *)0x0;
  SetBackwardReferences(pSVar3);
  return pSVar3;
}

Assistant:

SFPreset & SFPreset::operator=(const SFPreset & origin) {
  // Copy global zone.
  global_zone_ = nullptr;
  if (origin.has_global_zone()) {
    global_zone_ = std::make_unique<SFPresetZone>(origin.global_zone());
  }

  // Copy preset zones.
  zones_.clear();
  zones_.reserve(origin.zones().size());
  for (const auto & zone : origin.zones()) {
    zones_.push_back(std::make_unique<SFPresetZone>(*zone));
  }

  // Copy other fields.
  name_ = origin.name_;
  preset_number_ = origin.preset_number_;
  bank_ = origin.bank_;
  library_ = origin.library_;
  genre_ = origin.genre_;
  morphology_ = origin.morphology_;
  parent_file_ = nullptr;

  // Repair references.
  SetBackwardReferences();
  return *this;
}